

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long>::Flush
          (HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long> *this)

{
  byte bVar1;
  hugeint_t lhs;
  bool bVar2;
  ulong uVar3;
  hugeint_t rhs;
  hugeint_t local_28;
  
  bVar1 = this->digits;
  if ((bVar1 == 0) && (this->intermediate == 0)) {
    return true;
  }
  lhs.lower = (this->result).lower;
  lhs.upper = (this->result).upper;
  uVar3 = (this->result).lower | (this->result).upper;
  if (uVar3 != 0) {
    if (0x26 < bVar1) {
      return false;
    }
    uVar3 = *(ulong *)(Hugeint::POWERS_OF_TEN + (ulong)bVar1 * 0x10 + 8);
    bVar2 = Hugeint::TryMultiply
                      (lhs,*(hugeint_t *)(Hugeint::POWERS_OF_TEN + (ulong)bVar1 * 0x10),
                       &this->result);
    if (!bVar2) {
      return false;
    }
  }
  hugeint_t::hugeint_t(&local_28,this->intermediate);
  rhs.upper = uVar3;
  rhs.lower = local_28.upper;
  bVar2 = Hugeint::TryAddInPlace((Hugeint *)this,(hugeint_t *)local_28.lower,rhs);
  if (!bVar2) {
    return false;
  }
  this->digits = '\0';
  this->intermediate = 0;
  return true;
}

Assistant:

bool Flush() {
		if (digits == 0 && intermediate == 0) {
			return true;
		}
		if (result.lower != 0 || result.upper != 0) {
			if (digits > 38) {
				return false;
			}
			if (!OP::TryMultiply(result, OP::POWERS_OF_TEN[digits], result)) {
				return false;
			}
		}
		if (!OP::TryAddInPlace(result, ResultType(intermediate))) {
			return false;
		}
		digits = 0;
		intermediate = 0;
		return true;
	}